

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  uint32_t uVar3;
  char *pcVar4;
  size_t sVar5;
  int iVar6;
  byte *pbVar7;
  char input [1024];
  byte local_408 [1024];
  
  pbVar7 = local_408;
  printf("Please enter a roman numerals: ");
  pcVar4 = fgets((char *)local_408,0x400,_stdin);
  if (pcVar4 == (char *)0x0) {
    iVar6 = 1;
  }
  else {
    while( true ) {
      bVar1 = *pbVar7;
      if ((0x15 < bVar1 - 0x43) || ((0x280643U >> (bVar1 - 0x43 & 0x1f) & 1) == 0)) break;
      pbVar7 = pbVar7 + 1;
    }
    if ((bVar1 == 0) || (bVar1 == 10)) {
      iVar6 = 0;
      bVar2 = true;
    }
    else {
      puts("Invalid roman number!");
      iVar6 = 1;
      bVar2 = false;
    }
    if (bVar2) {
      sVar5 = strlen((char *)local_408);
      uVar3 = roman_to_decimal((char *)local_408,sVar5 - 1);
      iVar6 = 0;
      printf("%u\n",(ulong)uVar3);
    }
  }
  return iVar6;
}

Assistant:

int main(int argc, char** argv) {
  char input[1024];
  printf("Please enter a roman numerals: ");
  if (fgets(input, sizeof input, stdin) == NULL) return 1;

  for (size_t n = 0; input[n] != 0 && input[n] != '\n'; n++) {
    switch (input[n]) {
      case 'I':
      case 'V':
      case 'X':
      case 'L':
      case 'C':
      case 'D':
      case 'M':
        // noop
        break;
      default:
        printf("Invalid roman number!\n");
        return 1;
    }
  }

  uint32_t res = roman_to_decimal(input, strlen(input) - 1);
  printf("%" PRIu32 "\n", res);
  return 0;
}